

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Offset<reflection::Object> __thiscall
flatbuffers::StructDef::Serialize(StructDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  string *psVar1;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> fields;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> documentation
  ;
  Offset<flatbuffers::String> declaration_file;
  Offset<reflection::Object> OVar2;
  pointer ppFVar3;
  pointer ppFVar4;
  allocator<char> local_89;
  vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  field_offsets;
  string decl_file_in_project;
  string qualified_name;
  
  field_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  field_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  field_offsets.
  super__Vector_base<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar3 = (this->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (ppFVar4 = ppFVar3;
      ppFVar4 !=
      (this->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar4 = ppFVar4 + 1) {
    qualified_name._M_dataplus._M_p._0_4_ =
         FieldDef::Serialize(*ppFVar4,builder,
                             (uint16_t)
                             ((uint)((int)ppFVar3 -
                                    *(int *)&(this->fields).vec.
                                             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),parser
                            );
    std::
    vector<flatbuffers::Offset<reflection::Field>,std::allocator<flatbuffers::Offset<reflection::Field>>>
    ::emplace_back<flatbuffers::Offset<reflection::Field>>
              ((vector<flatbuffers::Offset<reflection::Field>,std::allocator<flatbuffers::Offset<reflection::Field>>>
                *)&field_offsets,(Offset<reflection::Field> *)&qualified_name);
    ppFVar3 = ppFVar3 + 1;
  }
  Namespace::GetFullyQualifiedName
            (&qualified_name,(this->super_Definition).defined_namespace,(string *)this,1000);
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,&qualified_name);
  fields = FlatBufferBuilderImpl<false>::
           CreateVectorOfSortedTables<reflection::Field,std::allocator<flatbuffers::Offset<reflection::Field>>>
                     (builder,&field_offsets);
  attributes = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  documentation.o = 0;
  if (((parser->opts).binary_schema_comments == true) &&
     ((this->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    documentation =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&(this->super_Definition).doc_comment);
  }
  psVar1 = (this->super_Definition).declaration_file;
  if (psVar1 == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&decl_file_in_project,"",&local_89)
    ;
  }
  else {
    std::__cxx11::string::string((string *)&decl_file_in_project,(string *)psVar1);
  }
  declaration_file =
       FlatBufferBuilderImpl<false>::CreateSharedString
                 (builder,decl_file_in_project._M_dataplus._M_p,
                  decl_file_in_project._M_string_length);
  OVar2 = reflection::CreateObject
                    (builder,name,fields,this->fixed,(int32_t)this->minalign,(int32_t)this->bytesize
                     ,attributes,documentation,declaration_file);
  std::__cxx11::string::~string((string *)&decl_file_in_project);
  std::__cxx11::string::~string((string *)&qualified_name);
  std::
  _Vector_base<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  ::~_Vector_base(&field_offsets.
                   super__Vector_base<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
                 );
  return (Offset<reflection::Object>)OVar2.o;
}

Assistant:

Offset<reflection::Object> StructDef::Serialize(FlatBufferBuilder *builder,
                                                const Parser &parser) const {
  std::vector<Offset<reflection::Field>> field_offsets;
  for (auto it = fields.vec.begin(); it != fields.vec.end(); ++it) {
    field_offsets.push_back((*it)->Serialize(
        builder, static_cast<uint16_t>(it - fields.vec.begin()), parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto flds__ = builder->CreateVectorOfSortedTables(&field_offsets);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateObject(
      *builder, name__, flds__, fixed, static_cast<int>(minalign),
      static_cast<int>(bytesize), attr__, docs__, file__);
}